

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall cmCTest::SetTest(cmCTest *this,string *ttype,bool report)

{
  bool bVar1;
  Part PVar2;
  pointer pPVar3;
  ostream *poVar4;
  char *msg;
  string local_1f8 [32];
  ostringstream local_1d8 [8];
  ostringstream cmCTestLog_msg;
  uint local_58;
  Part p;
  Part p_1;
  string local_48;
  byte local_21;
  string *psStack_20;
  bool report_local;
  string *ttype_local;
  cmCTest *this_local;
  
  local_21 = report;
  psStack_20 = ttype;
  ttype_local = (string *)this;
  cmsys::SystemTools::LowerCase(&local_48,ttype);
  bVar1 = std::operator==(&local_48,"all");
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar1) {
    for (local_58 = 0; local_58 != 0xc; local_58 = local_58 + 1) {
      pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      Private::PartInfo::Enable(pPVar3->Parts + local_58);
    }
    this_local._7_1_ = true;
  }
  else {
    PVar2 = GetPartFromName(this,psStack_20);
    if (PVar2 == PartCount) {
      if ((local_21 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1d8);
        poVar4 = std::operator<<((ostream *)local_1d8,"Don\'t know about test \"");
        poVar4 = std::operator<<(poVar4,(string *)psStack_20);
        poVar4 = std::operator<<(poVar4,"\" yet...");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        msg = (char *)std::__cxx11::string::c_str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0x336,msg,false);
        std::__cxx11::string::~string(local_1f8);
        std::__cxx11::ostringstream::~ostringstream(local_1d8);
      }
      this_local._7_1_ = false;
    }
    else {
      pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      Private::PartInfo::Enable(pPVar3->Parts + PVar2);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTest::SetTest(const std::string& ttype, bool report)
{
  if (cmSystemTools::LowerCase(ttype) == "all") {
    for (Part p = PartStart; p != PartCount; p = static_cast<Part>(p + 1)) {
      this->Impl->Parts[p].Enable();
    }
    return true;
  }
  Part p = this->GetPartFromName(ttype);
  if (p != PartCount) {
    this->Impl->Parts[p].Enable();
    return true;
  }
  if (report) {
    cmCTestLog(this, ERROR_MESSAGE,
               "Don't know about test \"" << ttype << "\" yet..."
                                          << std::endl);
  }
  return false;
}